

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTexture2LookupTestCase::funcAllowed
          (SparseTexture2LookupTestCase *this,GLint target,GLint format,FunctionToken *funcToken)

{
  bool bVar1;
  _Self local_38;
  _Self local_30;
  FunctionToken *local_28;
  FunctionToken *funcToken_local;
  GLint format_local;
  GLint target_local;
  SparseTexture2LookupTestCase *this_local;
  
  local_28 = funcToken;
  funcToken_local._0_4_ = format;
  funcToken_local._4_4_ = target;
  _format_local = this;
  local_30._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find
                 (&funcToken->allowedTargets,(key_type_conflict *)((long)&funcToken_local + 4));
  local_38._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end(&local_28->allowedTargets);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    return false;
  }
  if ((GLint)funcToken_local == 0x81a5) {
    bVar1 = std::operator==(&local_28->name,"sparseTextureLodARB");
    if ((bVar1) || (bVar1 = std::operator==(&local_28->name,"sparseTextureLodOffsetARB"), bVar1)) {
      if (funcToken_local._4_4_ != 0xde1) {
        return false;
      }
    }
    else {
      bVar1 = std::operator==(&local_28->name,"sparseTextureOffsetARB");
      if ((((bVar1) ||
           (bVar1 = std::operator==(&local_28->name,"sparseTextureGradOffsetARB"), bVar1)) ||
          (bVar1 = std::operator==(&local_28->name,"sparseTextureGatherOffsetARB"), bVar1)) ||
         (bVar1 = std::operator==(&local_28->name,"sparseTextureGatherOffsetsARB"), bVar1)) {
        if (((funcToken_local._4_4_ != 0xde1) && (funcToken_local._4_4_ != 0x8c1a)) &&
           (funcToken_local._4_4_ != 0x84f5)) {
          return false;
        }
      }
      else {
        bVar1 = std::operator==(&local_28->name,"sparseTexelFetchARB");
        if ((bVar1) || (bVar1 = std::operator==(&local_28->name,"sparseTexelFetchOffsetARB"), bVar1)
           ) {
          return false;
        }
        bVar1 = std::operator==(&local_28->name,"sparseTextureGradARB");
        if (bVar1) {
          if (funcToken_local._4_4_ == 0x9009) {
            return false;
          }
        }
        else {
          bVar1 = std::operator==(&local_28->name,"sparseImageLoadARB");
          if (bVar1) {
            return false;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool SparseTexture2LookupTestCase::funcAllowed(GLint target, GLint format, FunctionToken& funcToken)
{
	if (funcToken.allowedTargets.find(target) == funcToken.allowedTargets.end())
		return false;

	if (format == GL_DEPTH_COMPONENT16)
	{
		if (funcToken.name == "sparseTextureLodARB" || funcToken.name == "sparseTextureLodOffsetARB")
		{
			if (target != GL_TEXTURE_2D)
				return false;
		}
		else if (funcToken.name == "sparseTextureOffsetARB" || funcToken.name == "sparseTextureGradOffsetARB" ||
				 funcToken.name == "sparseTextureGatherOffsetARB" || funcToken.name == "sparseTextureGatherOffsetsARB")
		{
			if (target != GL_TEXTURE_2D && target != GL_TEXTURE_2D_ARRAY && target != GL_TEXTURE_RECTANGLE)
			{
				return false;
			}
		}
		else if (funcToken.name == "sparseTexelFetchARB" || funcToken.name == "sparseTexelFetchOffsetARB")
		{
			return false;
		}
		else if (funcToken.name == "sparseTextureGradARB")
		{
			if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
				return false;
		}
		else if (funcToken.name == "sparseImageLoadARB")
		{
			return false;
		}
	}

	return true;
}